

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeNumberArrayProperty<double>
               (string *key,vector<double,_std::allocator<double>_> *value,json *obj)

{
  json_value o;
  bool bVar1;
  size_type s_00;
  char *key_00;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_70;
  reference local_60;
  double *s;
  const_iterator __end0;
  const_iterator __begin0;
  vector<double,_std::allocator<double>_> *__range2;
  undefined1 local_30 [8];
  json ary;
  json *obj_local;
  vector<double,_std::allocator<double>_> *value_local;
  string *key_local;
  
  ary.m_value = (json_value)obj;
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(value);
  if (!bVar1) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_30,(nullptr_t)0x0);
    s_00 = std::vector<double,_std::allocator<double>_>::size(value);
    anon_unknown_57::JsonReserveArray
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_30,s_00);
    __end0 = std::vector<double,_std::allocator<double>_>::begin(value);
    s = (double *)std::vector<double,_std::allocator<double>_>::end(value);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                                       *)&s), o = ary.m_value, bVar1) {
      local_60 = __gnu_cxx::
                 __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
                 operator*(&__end0);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<const_double_&,_double,_0>(&local_70,local_60);
      anon_unknown_57::JsonPushBack((json *)local_30,&local_70);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_70);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&__end0);
    }
    key_00 = (char *)std::__cxx11::string::c_str();
    anon_unknown_57::JsonAddMember((json *)o.object,key_00,(json *)local_30);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)local_30);
  }
  return;
}

Assistant:

static void SerializeNumberArrayProperty(const std::string &key,
                                         const std::vector<T> &value,
                                         json &obj) {
  if (value.empty()) return;

  json ary;
  JsonReserveArray(ary, value.size());
  for (const auto &s : value) {
    JsonPushBack(ary, json(s));
  }
  JsonAddMember(obj, key.c_str(), std::move(ary));
}